

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

void __thiscall
soplex::LPRowSetBase<double>::add(LPRowSetBase<double> *this,LPRowSetBase<double> *newset)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  int *piVar6;
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  double in_stack_ffffffffffffff98;
  LPRowSetBase<double> *in_stack_ffffffffffffffa0;
  SVSetBase<double> *in_stack_ffffffffffffffb8;
  SVSetBase<double> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = num((LPRowSetBase<double> *)0x26d0dd);
  SVSetBase<double>::add<double>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  iVar2 = num((LPRowSetBase<double> *)0x26d0fa);
  iVar3 = VectorBase<double>::dim((VectorBase<double> *)0x26d10c);
  if (iVar3 < iVar2) {
    num((LPRowSetBase<double> *)0x26d130);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
    num((LPRowSetBase<double> *)0x26d159);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
    lVar4 = in_RDI + 0x98;
    num((LPRowSetBase<double> *)0x26d182);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffffd0,(int)((ulong)lVar4 >> 0x20),SUB81((ulong)lVar4 >> 0x18,0));
    num((LPRowSetBase<double> *)0x26d1ab);
    DataArray<int>::reSize
              ((DataArray<int> *)in_stack_ffffffffffffffa0,
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  local_18 = 0;
  while( true ) {
    iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    iVar2 = num((LPRowSetBase<double> *)0x26d1d1);
    if (iVar2 <= local_14) break;
    pdVar5 = lhs(in_stack_ffffffffffffffa0,iVar3);
    in_stack_ffffffffffffff98 = *pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    *pdVar5 = in_stack_ffffffffffffff98;
    pdVar5 = rhs(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    in_stack_ffffffffffffffa0 = (LPRowSetBase<double> *)*pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    *pdVar5 = (double)in_stack_ffffffffffffffa0;
    pdVar5 = obj(in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    dVar1 = *pdVar5;
    pdVar5 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffa0,
                        (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    *pdVar5 = dVar1;
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0xb0),local_18);
    iVar2 = *piVar6;
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0xb0),local_14);
    *piVar6 = iVar2;
    local_14 = local_14 + 1;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void add(const LPRowSetBase<R>& newset)
   {
      int i = num();

      SVSetBase<R>::add(newset);

      if(num() > left.dim())
      {
         left.reDim(num());
         right.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      for(int j = 0; i < num(); ++i, ++j)
      {
         left[i] = newset.lhs(j);
         right[i] = newset.rhs(j);
         object[i] = newset.obj(j);
         scaleExp[i] = newset.scaleExp[j];
      }
   }